

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Identifier __thiscall soul::heart::Parser::parseGeneralIdentifier(Parser *this)

{
  ProgramImpl *pPVar1;
  Identifier IVar2;
  string local_30;
  
  pPVar1 = (this->program).pimpl;
  readGeneralIdentifier_abi_cxx11_(&local_30,this);
  IVar2 = Allocator::get<std::__cxx11::string>(&pPVar1->allocator,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return (Identifier)IVar2.name;
}

Assistant:

Identifier parseGeneralIdentifier()
    {
        return program.getAllocator().get (readGeneralIdentifier());
    }